

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  Server *pSVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  HandlerResponse HVar9;
  int iVar10;
  const_iterator cVar11;
  ssize_t sVar12;
  long lVar13;
  int extraout_var;
  int extraout_var_00;
  ulong uVar14;
  bool bVar15;
  char cVar16;
  char *pcVar17;
  uint __len;
  ulong uVar18;
  ulong uVar19;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  pVar20;
  string __str;
  string s;
  string boundary;
  string content_type;
  key_type local_e0;
  string local_c0;
  undefined8 local_98;
  Request *local_90;
  allocator<char> local_81;
  Server *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  local_90 = req;
  if ((res->status < 400) ||
     ((this->error_handler_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_78 = &local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)local_78;
    if (need_apply_ranges) goto LAB_0016c0d5;
  }
  else {
    HVar9 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_78 = &local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)local_78;
    if (HVar9 == Handled || need_apply_ranges) {
LAB_0016c0d5:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_78 = &local_70.field_2;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_string_length = 0;
      local_70._M_dataplus._M_p = (pointer)local_78;
      apply_ranges(this,local_90,res,&local_50,&local_70);
    }
  }
  local_80 = this;
  if (close_connection) {
LAB_0016c239:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Connection","");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"close","");
    Response::set_header(res,&local_c0,&local_e0);
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Connection","");
    pVar20 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::equal_range(&(local_90->headers)._M_h,&local_e0);
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         )pVar20.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur ==
        pVar20.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)((long)&(((__node_type *)
                                   pVar20.first.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_storage._M_storage + 0x20);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar17,&local_81);
    iVar10 = std::__cxx11::string::compare((char *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (iVar10 == 0) goto LAB_0016c239;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"timeout=","");
    uVar18 = this->keep_alive_timeout_sec_;
    uVar19 = -uVar18;
    if (0 < (long)uVar18) {
      uVar19 = uVar18;
    }
    __len = 1;
    if (9 < uVar19) {
      uVar14 = uVar19;
      uVar6 = 4;
      do {
        __len = uVar6;
        if (uVar14 < 100) {
          __len = __len - 2;
          goto LAB_0016c29b;
        }
        if (uVar14 < 1000) {
          __len = __len - 1;
          goto LAB_0016c29b;
        }
        if (uVar14 < 10000) goto LAB_0016c29b;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar6 = __len + 4;
      } while (bVar15);
      __len = __len + 1;
    }
LAB_0016c29b:
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_e0,(char)__len - (char)((long)uVar18 >> 0x3f));
    detail::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p + -((long)uVar18 >> 0x3f),__len,uVar19);
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0._M_dataplus._M_p);
    pSVar5 = local_80;
    paVar1 = &local_e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_c0);
    uVar18 = pSVar5->keep_alive_max_count_;
    cVar16 = '\x01';
    if (9 < uVar18) {
      uVar19 = uVar18;
      cVar7 = '\x04';
      do {
        cVar16 = cVar7;
        if (uVar19 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_0016c371;
        }
        if (uVar19 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_0016c371;
        }
        if (uVar19 < 10000) goto LAB_0016c371;
        bVar15 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar7 = cVar16 + '\x04';
      } while (bVar15);
      cVar16 = cVar16 + '\x01';
    }
LAB_0016c371:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar16);
    detail::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar18);
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Keep-Alive","");
    Response::set_header(res,&local_e0,&local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((((res->body)._M_string_length != 0) || (res->content_length_ != 0)) ||
     ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Type","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Type","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"text/plain","");
      Response::set_header(res,&local_c0,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((((res->body)._M_string_length == 0) && (res->content_length_ == 0)) &&
     ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Length","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Length","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"0","");
      Response::set_header(res,&local_c0,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  iVar10 = std::__cxx11::string::compare((char *)local_90);
  if (iVar10 == 0) {
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Accept-Ranges","");
    cVar11 = detail::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(res->headers)._M_h,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Accept-Ranges","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"bytes","");
      Response::set_header(res,&local_c0,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pSVar5 = local_80;
  if ((local_80->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_80->post_routing_handler_)._M_invoker)
              ((_Any_data *)&local_80->post_routing_handler_,local_90,res);
  }
  pcVar17 = local_c0.field_2._M_local_buf + 8;
  local_c0._M_dataplus._M_p = (pointer)&PTR__BufferStream_002d7ee0;
  local_c0.field_2._M_allocated_capacity = 0;
  local_c0.field_2._M_local_buf[8] = '\0';
  local_98 = 0;
  local_c0._M_string_length = (size_type)pcVar17;
  sVar12 = detail::write_response_line((Stream *)&local_c0,res->status);
  if (sVar12 != 0) {
    if ((pSVar5->header_writer_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    lVar13 = (*(pSVar5->header_writer_)._M_invoker)
                       ((_Any_data *)&pSVar5->header_writer_,(Stream *)&local_c0,&res->headers);
    uVar4 = local_c0.field_2._M_allocated_capacity;
    sVar3 = local_c0._M_string_length;
    if (lVar13 != 0) {
      uVar18 = 0;
      do {
        if ((ulong)uVar4 <= uVar18) break;
        iVar10 = (*strm->_vptr_Stream[6])(strm,(char *)(sVar3 + uVar18));
        uVar18 = uVar18 + CONCAT44(extraout_var,iVar10);
      } while (-1 < extraout_var);
      if ((char *)local_c0._M_string_length != pcVar17) {
        operator_delete((void *)local_c0._M_string_length,
                        CONCAT71(local_c0.field_2._9_7_,local_c0.field_2._M_local_buf[8]) + 1);
      }
      iVar10 = std::__cxx11::string::compare((char *)local_90);
      bVar15 = true;
      if (iVar10 != 0) {
        uVar18 = (res->body)._M_string_length;
        if (uVar18 == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar8 = write_content_with_provider(local_80,strm,local_90,res,&local_70,&local_50);
            if (bVar8) {
              res->content_provider_success_ = true;
            }
            else {
              bVar15 = false;
            }
          }
        }
        else {
          pcVar2 = (res->body)._M_dataplus._M_p;
          uVar19 = 0;
          do {
            bVar15 = uVar18 <= uVar19;
            if (uVar18 <= uVar19) break;
            iVar10 = (*strm->_vptr_Stream[6])(strm,pcVar2 + uVar19);
            uVar19 = uVar19 + CONCAT44(extraout_var_00,iVar10);
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_80->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_80->logger_)._M_invoker)((_Any_data *)&local_80->logger_,local_90,res);
      }
      goto LAB_0016c88c;
    }
  }
  if ((char *)local_c0._M_string_length != pcVar17) {
    operator_delete((void *)local_c0._M_string_length,
                    CONCAT71(local_c0.field_2._9_7_,local_c0.field_2._M_local_buf[8]) + 1);
  }
  bVar15 = false;
LAB_0016c88c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != local_78) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar15;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::string s = "timeout=";
    s += std::to_string(keep_alive_timeout_sec_);
    s += ", max=";
    s += std::to_string(keep_alive_max_count_);
    res.set_header("Keep-Alive", s);
  }

  if ((!res.body.empty() || res.content_length_ > 0 || res.content_provider_) &&
      !res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (res.body.empty() && !res.content_length_ && !res.content_provider_ &&
      !res.has_header("Content-Length")) {
    res.set_header("Content-Length", "0");
  }

  if (req.method == "HEAD" && !res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;
    if (!detail::write_response_line(bstrm, res.status)) { return false; }
    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}